

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator::GenerateMembers
          (ImmutableStringOneofFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  bool bVar3;
  LogMessage *pLVar4;
  Options *pOVar5;
  string_view local_3c8;
  string_view local_3b8;
  Semantic local_3a4;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_3a0;
  string_view local_398;
  string_view local_388;
  string_view local_378;
  Options local_368;
  Semantic local_314;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_310;
  string_view local_308;
  string_view local_2f8;
  string_view local_2e8;
  Options local_2d8;
  Semantic local_284;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_280;
  string_view local_278;
  string_view local_268;
  string_view local_258;
  Options local_248;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1f0;
  string_view local_1e8;
  string_view local_1d8;
  string_view local_1c8;
  Options local_1b8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_160;
  string_view local_158;
  string_view local_148;
  string_view local_138;
  Options local_128;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_d0;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  Options local_98;
  byte local_31;
  LogMessage local_30;
  Voidify local_19;
  Printer *local_18;
  Printer *printer_local;
  ImmutableStringOneofFieldLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  PrintExtraFieldInfo(&(this->super_ImmutableStringFieldLiteGenerator).variables_,printer);
  bVar3 = FieldDescriptor::has_presence((this->super_ImmutableStringFieldLiteGenerator).descriptor_)
  ;
  local_31 = 0;
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/lite/string_field.cc"
               ,0x168,"descriptor_->has_presence()");
    local_31 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar4);
  }
  pPVar2 = local_18;
  if ((local_31 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldLiteGenerator).context_);
  java::Options::Options(&local_98,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,HAZZER,&local_98,false,false,false);
  java::Options::~Options(&local_98);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a8,
             "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"}");
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(pPVar2,local_b8,local_c8,pFVar1,local_d0)
  ;
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldLiteGenerator).context_);
  java::Options::Options(&local_128,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,GETTER,&local_128,false,false,false);
  java::Options::~Options(&local_128);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_138,
             "@java.lang.Override\n$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n  java.lang.String ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = (java.lang.String) $oneof_name$_;\n  }\n  return ref;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_138);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_158,"}");
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_160);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_148,local_158,pFVar1,local_160);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldLiteGenerator).context_);
  java::Options::Options(&local_1b8,pOVar5);
  WriteFieldStringBytesAccessorDocComment(pPVar2,pFVar1,GETTER,&local_1b8,false,false,false);
  java::Options::~Options(&local_1b8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1c8,
             "@java.lang.Override\n$deprecation$public com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$() {\n  java.lang.String ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = (java.lang.String) $oneof_name$_;\n  }\n  return com.google.protobuf.ByteString.copyFromUtf8(ref);\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_1c8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e8,"}");
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1f0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_1d8,local_1e8,pFVar1,local_1f0);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldLiteGenerator).context_);
  java::Options::Options(&local_248,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,SETTER,&local_248,false,false,true);
  java::Options::~Options(&local_248);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_258,
             "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\nprivate void ${$set$capitalized_name$$}$(\n    java.lang.String value) {\n  value.getClass();  // minimal bytecode null check\n  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_258);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_268,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_278,"}");
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  local_284 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_280,&local_284);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_268,local_278,pFVar1,local_280);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldLiteGenerator).context_);
  java::Options::Options(&local_2d8,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,CLEARER,&local_2d8,false,false,true);
  java::Options::~Options(&local_2d8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2e8,
             "private void ${$clear$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n  }\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_2e8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2f8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_308,"}");
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  local_314 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_310,&local_314);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_2f8,local_308,pFVar1,local_310);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldLiteGenerator).context_);
  java::Options::Options(&local_368,pOVar5);
  WriteFieldStringBytesAccessorDocComment(pPVar2,pFVar1,SETTER,&local_368,false,false,true);
  java::Options::~Options(&local_368);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_378,
             "private void ${$set$capitalized_name$Bytes$}$(\n    com.google.protobuf.ByteString value) {\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_378);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_388,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_398,"}");
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  local_3a4 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_3a0,&local_3a4);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_388,local_398,pFVar1,local_3a0);
  bVar3 = CheckUtf8((this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  pPVar2 = local_18;
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_3b8,"  checkByteStringIsUtf8(value);\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_3b8);
  }
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3c8,"  $oneof_name$_ = value.toStringUtf8();\n  $set_oneof_case_message$;\n}\n")
  ;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_3c8);
  return;
}

Assistant:

void ImmutableStringOneofFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  ABSL_DCHECK(descriptor_->has_presence());
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n"
      "  java.lang.String ref $default_init$;\n"
      "  if ($has_oneof_case_message$) {\n"
      "    ref = (java.lang.String) $oneof_name$_;\n"
      "  }\n"
      "  return ref;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, GETTER,
                                          context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$() {\n"
                 "  java.lang.String ref $default_init$;\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    ref = (java.lang.String) $oneof_name$_;\n"
                 "  }\n"
                 "  return com.google.protobuf.ByteString.copyFromUtf8(ref);\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\n"
                 "private void ${$set$capitalized_name$$}$(\n"
                 "    java.lang.String value) {\n"
                 "  value.getClass();  // minimal bytecode null check\n"
                 "  $set_oneof_case_message$;\n"
                 "  $oneof_name$_ = value;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void ${$clear$capitalized_name$$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    $clear_oneof_case_message$;\n"
                 "    $oneof_name$_ = null;\n"
                 "  }\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldStringBytesAccessorDocComment(
      printer, descriptor_, SETTER, context_->options(), /* builder */ false,
      /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void ${$set$capitalized_name$Bytes$}$(\n"
                 "    com.google.protobuf.ByteString value) {\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_, "  checkByteStringIsUtf8(value);\n");
  }
  printer->Print(variables_,
                 "  $oneof_name$_ = value.toStringUtf8();\n"
                 "  $set_oneof_case_message$;\n"
                 "}\n");
}